

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O0

IUINT32 ikcp_check(ikcpcb *kcp,IUINT32 current)

{
  uint uVar1;
  uint local_70;
  IINT32 diff;
  IKCPSEG *seg;
  IQUEUEHEAD *p;
  uint local_50;
  IUINT32 minimal;
  IINT32 tm_packet;
  IINT32 tm_flush;
  IUINT32 ts_flush;
  IUINT32 current_local;
  ikcpcb *kcp_local;
  
  tm_packet = kcp->ts_flush;
  local_50 = 0x7fffffff;
  kcp_local._4_4_ = current;
  if (kcp->updated != 0) {
    if ((9999 < (int)(current - tm_packet)) || ((int)(current - tm_packet) < -10000)) {
      tm_packet = current;
    }
    if ((int)(current - tm_packet) < 0) {
      local_70 = tm_packet - current;
      for (seg = (IKCPSEG *)(kcp->snd_buf).next; seg != (IKCPSEG *)&kcp->snd_buf;
          seg = (IKCPSEG *)(seg->node).next) {
        uVar1 = seg->resendts - current;
        if ((int)uVar1 < 1) {
          return current;
        }
        if ((int)uVar1 < (int)local_50) {
          local_50 = uVar1;
        }
      }
      if ((int)local_50 < (int)local_70) {
        local_70 = local_50;
      }
      p._4_4_ = local_70;
      if (kcp->interval <= local_70) {
        p._4_4_ = kcp->interval;
      }
      kcp_local._4_4_ = current + p._4_4_;
    }
  }
  return kcp_local._4_4_;
}

Assistant:

IUINT32 ikcp_check(const ikcpcb *kcp, IUINT32 current)
{
	IUINT32 ts_flush = kcp->ts_flush;
	IINT32 tm_flush = 0x7fffffff;
	IINT32 tm_packet = 0x7fffffff;
	IUINT32 minimal = 0;
	struct IQUEUEHEAD *p;

	if (kcp->updated == 0) {
		return current;
	}

	if (_itimediff(current, ts_flush) >= 10000 ||
		_itimediff(current, ts_flush) < -10000) {
		ts_flush = current;
	}

	if (_itimediff(current, ts_flush) >= 0) {
		return current;
	}

	tm_flush = _itimediff(ts_flush, current);

	for (p = kcp->snd_buf.next; p != &kcp->snd_buf; p = p->next) {
		const IKCPSEG *seg = iqueue_entry(p, const IKCPSEG, node);
		IINT32 diff = _itimediff(seg->resendts, current);
		if (diff <= 0) {
			return current;
		}
		if (diff < tm_packet) tm_packet = diff;
	}

	minimal = (IUINT32)(tm_packet < tm_flush ? tm_packet : tm_flush);
	if (minimal >= kcp->interval) minimal = kcp->interval;

	return current + minimal;
}